

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O1

bool sensors_analytics::utils::CheckUtf8Valid(string *str)

{
  byte bVar1;
  byte bVar2;
  byte *pbVar3;
  long lVar4;
  byte *pbVar5;
  size_type sVar6;
  long lVar7;
  
  lVar4 = (long)(int)str->_M_string_length;
  if (lVar4 < 1) {
    sVar6 = 0;
  }
  else {
    pbVar3 = (byte *)(str->_M_dataplus)._M_p;
    pbVar5 = pbVar3;
    do {
      bVar1 = *pbVar5;
      lVar7 = 1;
      if (((((0xd < bVar1) || ((0x2600U >> (bVar1 & 0x1f) & 1) == 0)) &&
           (0x5e < (byte)(bVar1 - 0x20))) &&
          (((0x1d < (byte)(bVar1 + 0x3e) || (lVar7 = 2, -0x41 < (char)pbVar5[1])) &&
           ((bVar1 != 0xe0 || (((pbVar5[1] & 0xe0) != 0xa0 || (lVar7 = 3, -0x41 < (char)pbVar5[2])))
            ))))) &&
         ((0xb < (byte)(bVar1 + 0x1f) && (bVar1 & 0xfe) != 0xee ||
          ((-0x41 < (char)pbVar5[1] || (lVar7 = 3, -0x41 < (char)pbVar5[2])))))) {
        if (bVar1 == 0xf0) {
          if (((byte)(pbVar5[1] + 0x70) < 0x30) && ((char)pbVar5[2] < -0x40)) {
            lVar7 = 4;
            bVar2 = pbVar5[3];
            goto joined_r0x0010f420;
          }
        }
        else if ((bVar1 == 0xed) && ((char)pbVar5[1] < -0x60)) {
          lVar7 = 3;
          bVar2 = pbVar5[2];
joined_r0x0010f420:
          if ((char)bVar2 < -0x40) goto LAB_0010f345;
        }
        if (((((2 < (byte)(bVar1 + 0xf)) || (-0x41 < (char)pbVar5[1])) || (-0x41 < (char)pbVar5[2]))
            || (lVar7 = 4, -0x41 < (char)pbVar5[3])) &&
           (((bVar1 != 0xf4 || (-0x71 < (char)pbVar5[1])) ||
            ((-0x41 < (char)pbVar5[2] || (lVar7 = 4, -0x41 < (char)pbVar5[3])))))) {
          return false;
        }
      }
LAB_0010f345:
      pbVar5 = pbVar5 + lVar7;
      sVar6 = (long)pbVar5 - (long)pbVar3;
    } while ((long)sVar6 < lVar4);
  }
  return sVar6 == str->_M_string_length;
}

Assistant:

bool CheckUtf8Valid(const string &str) {
  // https://stackoverflow.com/a/1031773
  const unsigned char *bytes = (const unsigned char *) str.data();
  const unsigned char *begin = bytes;
  while (bytes - begin < (int)str.length()) {
    if ((bytes[0] == 0x09 || bytes[0] == 0x0A || bytes[0] == 0x0D ||
        (0x20 <= bytes[0] && bytes[0] <= 0x7E))) {
      bytes += 1;
      continue;
    }
    if (((0xC2 <= bytes[0] && bytes[0] <= 0xDF)
        && (0x80 <= bytes[1] && bytes[1] <= 0xBF))) {
      bytes += 2;
      continue;
    }
    if ((bytes[0] == 0xE0 && (0xA0 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (((0xE1 <= bytes[0] && bytes[0] <= 0xEC) || bytes[0] == 0xEE
            || bytes[0] == 0xEF) &&
            (0x80 <= bytes[1] && bytes[1] <= 0xBF)
            && (0x80 <= bytes[2] && bytes[2] <= 0xBF)) ||
        (bytes[0] == 0xED && (0x80 <= bytes[1] && bytes[1] <= 0x9F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF))) {
      bytes += 3;
      continue;
    }
    if ((bytes[0] == 0xF0 && (0x90 <= bytes[1] && bytes[1] <= 0xBF) &&
        (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
        (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        ((0xF1 <= bytes[0] && bytes[0] <= 0xF3)
            && (0x80 <= bytes[1] && bytes[1] <= 0xBF) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF)
            && (0x80 <= bytes[3] && bytes[3] <= 0xBF)) ||
        (bytes[0] == 0xF4 && (0x80 <= bytes[1] && bytes[1] <= 0x8F) &&
            (0x80 <= bytes[2] && bytes[2] <= 0xBF) &&
            (0x80 <= bytes[3] && bytes[3] <= 0xBF))) {
      bytes += 4;
      continue;
    }
    return false;
  }
  return bytes - begin == str.length();
}